

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void cf_sha256_init(cf_sha256_context *ctx)

{
  *(undefined8 *)&ctx->blocks = 0;
  ctx->npartial = 0;
  ctx->partial[0x30] = '\0';
  ctx->partial[0x31] = '\0';
  ctx->partial[0x32] = '\0';
  ctx->partial[0x33] = '\0';
  ctx->partial[0x34] = '\0';
  ctx->partial[0x35] = '\0';
  ctx->partial[0x36] = '\0';
  ctx->partial[0x37] = '\0';
  ctx->partial[0x38] = '\0';
  ctx->partial[0x39] = '\0';
  ctx->partial[0x3a] = '\0';
  ctx->partial[0x3b] = '\0';
  ctx->partial[0x3c] = '\0';
  ctx->partial[0x3d] = '\0';
  ctx->partial[0x3e] = '\0';
  ctx->partial[0x3f] = '\0';
  ctx->partial[0x20] = '\0';
  ctx->partial[0x21] = '\0';
  ctx->partial[0x22] = '\0';
  ctx->partial[0x23] = '\0';
  ctx->partial[0x24] = '\0';
  ctx->partial[0x25] = '\0';
  ctx->partial[0x26] = '\0';
  ctx->partial[0x27] = '\0';
  ctx->partial[0x28] = '\0';
  ctx->partial[0x29] = '\0';
  ctx->partial[0x2a] = '\0';
  ctx->partial[0x2b] = '\0';
  ctx->partial[0x2c] = '\0';
  ctx->partial[0x2d] = '\0';
  ctx->partial[0x2e] = '\0';
  ctx->partial[0x2f] = '\0';
  ctx->partial[0x10] = '\0';
  ctx->partial[0x11] = '\0';
  ctx->partial[0x12] = '\0';
  ctx->partial[0x13] = '\0';
  ctx->partial[0x14] = '\0';
  ctx->partial[0x15] = '\0';
  ctx->partial[0x16] = '\0';
  ctx->partial[0x17] = '\0';
  ctx->partial[0x18] = '\0';
  ctx->partial[0x19] = '\0';
  ctx->partial[0x1a] = '\0';
  ctx->partial[0x1b] = '\0';
  ctx->partial[0x1c] = '\0';
  ctx->partial[0x1d] = '\0';
  ctx->partial[0x1e] = '\0';
  ctx->partial[0x1f] = '\0';
  ctx->partial[0] = '\0';
  ctx->partial[1] = '\0';
  ctx->partial[2] = '\0';
  ctx->partial[3] = '\0';
  ctx->partial[4] = '\0';
  ctx->partial[5] = '\0';
  ctx->partial[6] = '\0';
  ctx->partial[7] = '\0';
  ctx->partial[8] = '\0';
  ctx->partial[9] = '\0';
  ctx->partial[10] = '\0';
  ctx->partial[0xb] = '\0';
  ctx->partial[0xc] = '\0';
  ctx->partial[0xd] = '\0';
  ctx->partial[0xe] = '\0';
  ctx->partial[0xf] = '\0';
  ctx->H[0] = 0x6a09e667;
  ctx->H[1] = 0xbb67ae85;
  ctx->H[2] = 0x3c6ef372;
  ctx->H[3] = 0xa54ff53a;
  ctx->H[4] = 0x510e527f;
  ctx->H[5] = 0x9b05688c;
  ctx->H[6] = 0x1f83d9ab;
  ctx->H[7] = 0x5be0cd19;
  return;
}

Assistant:

void cf_sha256_init(cf_sha256_context *ctx)
{
  memset(ctx, 0, sizeof *ctx);
  ctx->H[0] = 0x6a09e667;
  ctx->H[1] = 0xbb67ae85;
  ctx->H[2] = 0x3c6ef372;
  ctx->H[3] = 0xa54ff53a;
  ctx->H[4] = 0x510e527f;
  ctx->H[5] = 0x9b05688c;
  ctx->H[6] = 0x1f83d9ab;
  ctx->H[7] = 0x5be0cd19;
}